

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall
cmCTestLaunch::LoadScrapeRules
          (cmCTestLaunch *this,char *purpose,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  undefined1 local_4a8 [8];
  RegularExpression rex;
  string line;
  undefined1 local_248 [8];
  ifstream fin;
  undefined1 local_40 [8];
  string fname;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps_local;
  char *purpose_local;
  cmCTestLaunch *this_local;
  
  fname.field_2._8_8_ = regexps;
  regexps_local =
       (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)purpose;
  purpose_local = (char *)this;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[7],char_const*&,char_const(&)[5]>
            ((string *)local_40,&(this->Reporter).LogDir,(char (*) [7])0x1104c15,
             (char **)&regexps_local,(char (*) [5])0x1101eaa);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_248,pcVar3,_Var2);
  std::__cxx11::string::string((string *)&rex.progsize);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_4a8);
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)local_248,(string *)&rex.progsize,(bool *)0x0,
                            0xffffffffffffffff), bVar1) {
    bVar1 = cmsys::RegularExpression::compile
                      ((RegularExpression *)local_4a8,(string *)&rex.progsize);
    if (bVar1) {
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                 fname.field_2._8_8_,(value_type *)local_4a8);
    }
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_4a8);
  std::__cxx11::string::~string((string *)&rex.progsize);
  std::ifstream::~ifstream(local_248);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules(
  const char* purpose, std::vector<cmsys::RegularExpression>& regexps) const
{
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "Custom", purpose, ".txt");
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  cmsys::RegularExpression rex;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (rex.compile(line)) {
      regexps.push_back(rex);
    }
  }
}